

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromise::ExtractSnapObjectDataInto
          (JavascriptPromise *this,SnapObject *objData,SlabAllocator *alloc)

{
  Var v;
  code *pcVar1;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar2;
  bool bVar3;
  uint uVar4;
  SnapPromiseInfo *addtlInfo;
  undefined4 *puVar5;
  SnapPromiseReactionInfo *pSVar6;
  Type *pTVar7;
  unsigned_long *dependsOnArray;
  Type *pTVar8;
  uint32 i;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 local_90 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  SListNodeBase<Memory::Recycler> local_50;
  SlabAllocator *local_48;
  Iterator local_40;
  
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_90 = (undefined1  [8])&PTR_IsReadOnly_013cc0d0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.buffer._0_4_ =
       0;
  depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  depOnList._40_8_ = objData;
  local_48 = alloc;
  addtlInfo = (SnapPromiseInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<48ul>(alloc);
  v = (this->result).ptr;
  addtlInfo->Result = v;
  if (v != (Var)0x0) {
    bVar3 = TTD::JsSupport::IsVarComplexKind(v);
    if (bVar3) {
      local_40.list =
           (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
           (this->result).ptr;
      JsUtil::
      List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                ((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)local_90,(unsigned_long *)&local_40);
    }
  }
  addtlInfo->Status = (uint)this->status;
  addtlInfo->isHandled = this->isHandled;
  addtlInfo->ResolveReactionCount = 0;
  pSVar9 = (this->reactions).ptr;
  if (pSVar9 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    uVar4 = 0;
  }
  else {
    local_40.list =
         &pSVar9->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    local_40.current = (NodeBase *)pSVar9;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar9 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) goto LAB_00b9f803;
        *puVar5 = 0;
      }
      pSVar2 = local_40.list;
      SListNodeBase<Memory::Recycler>::Next(&local_50);
      if (local_50.next.ptr == (Type)pSVar2) break;
      SListNodeBase<Memory::Recycler>::Next(&local_50);
      local_40.current = (NodeBase *)local_50.next.ptr;
      SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::Data
                (&local_40);
      addtlInfo->ResolveReactionCount = addtlInfo->ResolveReactionCount + 1;
      pSVar9 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               local_40.current;
    }
    uVar4 = addtlInfo->ResolveReactionCount;
  }
  addtlInfo->RejectReactionCount = uVar4;
  addtlInfo->ResolveReactions = (SnapPromiseReactionInfo *)0x0;
  addtlInfo->RejectReactions = (SnapPromiseReactionInfo *)0x0;
  if (uVar4 != 0) {
    pSVar6 = TTD::SlabAllocatorBase<0>::
             SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(local_48,(ulong)uVar4);
    addtlInfo->ResolveReactions = pSVar6;
    pSVar6 = TTD::SlabAllocatorBase<0>::
             SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>
                       (local_48,(ulong)addtlInfo->RejectReactionCount);
    addtlInfo->RejectReactions = pSVar6;
    pSVar9 = (this->reactions).ptr;
    uVar11 = 0;
    local_40.list =
         &pSVar9->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    local_40.current = (NodeBase *)pSVar9;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      if (pSVar9 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
LAB_00b9f803:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      pSVar2 = local_40.list;
      SListNodeBase<Memory::Recycler>::Next(&local_50);
      if (local_50.next.ptr == (Type)pSVar2) break;
      SListNodeBase<Memory::Recycler>::Next(&local_50);
      local_40.current = (NodeBase *)local_50.next.ptr;
      pTVar7 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_40);
      JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                (pTVar7->resolveReaction,addtlInfo->ResolveReactions + uVar11,
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)local_90,local_48);
      pTVar7 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_40);
      JavascriptPromiseReaction::ExtractSnapPromiseReactionInto
                (pTVar7->rejectReaction,addtlInfo->RejectReactions + uVar11,
                 (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)local_90,local_48);
      uVar11 = (ulong)((int)uVar11 + 1);
      pSVar9 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               local_40.current;
    } while( true );
  }
  uVar4 = (uint)depOnList.super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                buffer;
  uVar11 = (ulong)(uint)depOnList.
                        super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>.
                        buffer;
  if (uVar11 == 0) {
    TTD::NSSnapObjects::
    SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
              ((SnapObject *)depOnList._40_8_,addtlInfo);
  }
  else {
    dependsOnArray = TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(local_48,uVar11);
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      pTVar8 = JsUtil::
               List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_90,(int)uVar10);
      dependsOnArray[uVar10] = *pTVar8;
    }
    TTD::NSSnapObjects::
    StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
              ((SnapObject *)depOnList._40_8_,addtlInfo,local_48,uVar4,dependsOnArray);
  }
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        local_90);
  return;
}

Assistant:

void JavascriptPromise::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);

        TTD::NSSnapObjects::SnapPromiseInfo* spi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseInfo>();

        spi->Result = this->result;

        //Primitive kinds always inflated first so we only need to deal with complex kinds as depends on
        if(this->result != nullptr && TTD::JsSupport::IsVarComplexKind(this->result))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->result));
        }

        spi->Status = this->GetStatus();
        spi->isHandled = this->GetIsHandled();

        // get count of # of reactions
        spi->ResolveReactionCount = 0;
        if (this->reactions != nullptr)
        {
            this->reactions->Map([&spi](JavascriptPromiseReactionPair pair) {
                spi->ResolveReactionCount++;
            });
        }
        spi->RejectReactionCount = spi->ResolveReactionCount;

        // move resolve & reject reactions into slab
        spi->ResolveReactions = nullptr;
        spi->RejectReactions = nullptr;
        if(spi->ResolveReactionCount != 0)
        {
            spi->ResolveReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->ResolveReactionCount);
            spi->RejectReactions = alloc.SlabAllocateArray<TTD::NSSnapValues::SnapPromiseReactionInfo>(spi->RejectReactionCount);

            JavascriptPromiseReactionList::Iterator it = this->reactions->GetIterator();
            uint32 i = 0;
            while (it.Next())
            {
                it.Data().resolveReaction->ExtractSnapPromiseReactionInto(spi->ResolveReactions + i, depOnList, alloc);
                it.Data().rejectReaction->ExtractSnapPromiseReactionInto(spi->RejectReactions + i, depOnList, alloc);
                ++i;
            }
        }

        //see what we need to do wrt dependencies
        if(depOnList.Count() == 0)
        {
            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi);
        }
        else
        {
            uint32 depOnCount = depOnList.Count();
            TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

            for(uint32 i = 0; i < depOnCount; ++i)
            {
                depOnArray[i] = depOnList.Item(i);
            }

            TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseObject>(objData, spi, alloc, depOnCount, depOnArray);
        }
    }